

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFunctionDecPOMDPDiscrete.cpp
# Opt level: O0

double __thiscall
ValueFunctionDecPOMDPDiscrete::GetCached
          (ValueFunctionDecPOMDPDiscrete *this,Index sI,Index JOHI,bool *valid)

{
  bool bVar1;
  value_type *pvVar2;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  Index in_EDX;
  Index in_ESI;
  ValueFunctionDecPOMDPDiscrete *in_RDI;
  const_iterator it;
  CacheType *this_00;
  iterator local_48;
  c_iterator<boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_double>_>,_const_boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_double>_>_*>
  local_40;
  Index local_34;
  iterator local_30;
  c_iterator<boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_double>_>,_const_boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_double>_>_*>
  local_28;
  byte *local_20;
  double local_8;
  
  local_20 = (byte *)CONCAT71(in_register_00000009,in_CL);
  this_00 = &in_RDI->_m_cache;
  local_34 = GetCombinedIndex(in_RDI,in_ESI,in_EDX);
  local_30.node_ =
       (node_pointer)
       boost::unordered::
       unordered_map<unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
       ::find(this_00,(key_type_conflict *)0x8d7a6a);
  boost::unordered::iterator_detail::
  c_iterator<boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_double>_>,_const_boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_double>_>_*>
  ::c_iterator(&local_28,&local_30);
  local_48.node_ =
       (node_pointer)
       boost::unordered::
       unordered_map<unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
       ::end(this_00);
  boost::unordered::iterator_detail::
  c_iterator<boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_double>_>,_const_boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_double>_>_*>
  ::c_iterator(&local_40,&local_48);
  bVar1 = boost::unordered::iterator_detail::operator!=(&local_28,&local_40);
  *local_20 = bVar1;
  if ((*local_20 & 1) == 0) {
    local_8 = 0.0;
  }
  else {
    pvVar2 = boost::unordered::iterator_detail::
             c_iterator<boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_double>_>,_const_boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_double>_>_*>
             ::operator->((c_iterator<boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_double>_>,_const_boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_double>_>_*>
                           *)0x8d7acf);
    local_8 = pvVar2->second;
  }
  return local_8;
}

Assistant:

double ValueFunctionDecPOMDPDiscrete::GetCached(Index sI, Index JOHI,bool &valid)
{
    CacheType::const_iterator it=_m_cache.find(GetCombinedIndex(sI, JOHI));
    valid=(it!=_m_cache.end());
    if (valid)
        return it->second;
    else
        return 0;
}